

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O1

bool slang::ast::AssertionExpr::checkAssertionCall
               (CallExpression *call,ASTContext *context,DiagCode outArgCode,DiagCode refArgCode,
               optional<slang::DiagCode> sysTaskCode,SourceRange range)

{
  int iVar1;
  SystemSubroutine *pSVar2;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> pSVar3;
  pointer ppEVar4;
  ulong uVar5;
  size_type sVar6;
  pointer ppFVar7;
  bool bVar8;
  uint uVar9;
  variant_alternative_t<1UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *pvVar10;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *ppSVar11;
  Diagnostic *this;
  Symbol *pSVar12;
  Diagnostic *this_00;
  SourceLocation noteLocation;
  ulong uVar13;
  long lVar14;
  bool bVar15;
  
  if (*(__index_type *)
       ((long)&(call->subroutine).
               super__Variant_base<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
               .
               super__Move_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
               .
               super__Copy_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
               .
               super__Move_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
               .
               super__Copy_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
               .
               super__Variant_storage_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
       + 0x30) == '\x01') {
    pvVar10 = std::
              get<1ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                        (&call->subroutine);
    pSVar2 = (pvVar10->subroutine).ptr;
    if (pSVar2 == (SystemSubroutine *)0x0) {
      assert::assertFailed
                ("ptr",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                 ,0x26,
                 "T slang::not_null<const slang::ast::SystemSubroutine *>::get() const [T = const slang::ast::SystemSubroutine *]"
                );
    }
    if (((uint6)sysTaskCode.super__Optional_base<slang::DiagCode,_true,_true>._M_payload.
                super__Optional_payload_base<slang::DiagCode> & 0x100000000) == 0 ||
        pSVar2->kind != Function) {
      if (pSVar2->hasOutputArgs != true) goto LAB_00386bd3;
    }
    else {
      outArgCode = sysTaskCode.super__Optional_base<slang::DiagCode,_true,_true>._M_payload.
                   super__Optional_payload_base<slang::DiagCode>._M_payload;
    }
    ASTContext::addDiag(context,outArgCode,range);
LAB_00386bc9:
    bVar15 = false;
  }
  else {
    ppSVar11 = std::
               get<0ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                         (&call->subroutine);
    pSVar3 = *ppSVar11;
    ppEVar4 = (call->arguments_).data_;
    uVar5 = (call->arguments_).size_;
    if ((pSVar3->super_Scope).deferredMemberIndex != Invalid) {
      Scope::elaborate(&pSVar3->super_Scope);
    }
    sVar6 = (pSVar3->arguments).size_;
    bVar15 = sVar6 == 0;
    if (!bVar15) {
      ppFVar7 = (pSVar3->arguments).data_;
      lVar14 = 0;
      uVar13 = 0;
      do {
        iVar1 = *(int *)(*(long *)((long)ppFVar7 + lVar14) + 0x90);
        if (iVar1 - 1U < 2) {
          this = ASTContext::addDiag(context,outArgCode,range);
          noteLocation = *(SourceLocation *)(*(long *)((long)ppFVar7 + lVar14) + 0x18);
LAB_00386ae8:
          Diagnostic::addNote(this,(DiagCode)0x40001,noteLocation);
          bVar8 = false;
        }
        else {
          if (iVar1 == 3) {
            if (uVar5 <= uVar13) {
              assert::assertFailed
                        ("index < args.size()",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/AssertionExpr.cpp"
                         ,0x11e,
                         "static bool slang::ast::AssertionExpr::checkAssertionCall(const CallExpression &, const ASTContext &, DiagCode, DiagCode, std::optional<DiagCode>, SourceRange)"
                        );
            }
            pSVar12 = Expression::getSymbolReference(ppEVar4[uVar13],true);
            if ((((pSVar12 != (Symbol *)0x0) && (uVar9 = pSVar12->kind - Variable, uVar9 < 0x19)) &&
                ((0x1800c0fU >> (uVar9 & 0x1f) & 1) != 0)) && ((int)pSVar12[2].name._M_len == 0)) {
              this = ASTContext::addDiag(context,refArgCode,ppEVar4[uVar13]->sourceRange);
              this_00 = Diagnostic::operator<<(this,pSVar12->name);
              Diagnostic::operator<<
                        (this_00,*(string_view *)(*(long *)((long)ppFVar7 + lVar14) + 8));
              noteLocation = pSVar12->location;
              goto LAB_00386ae8;
            }
          }
          uVar13 = uVar13 + 1;
          bVar8 = true;
        }
        if (!bVar8) {
          if (!bVar15) goto LAB_00386bc9;
          break;
        }
        lVar14 = lVar14 + 8;
        bVar15 = sVar6 << 3 == lVar14;
      } while (!bVar15);
    }
LAB_00386bd3:
    bVar15 = true;
  }
  return bVar15;
}

Assistant:

bool AssertionExpr::checkAssertionCall(const CallExpression& call, const ASTContext& context,
                                       DiagCode outArgCode, DiagCode refArgCode,
                                       std::optional<DiagCode> sysTaskCode, SourceRange range) {
    if (call.isSystemCall()) {
        auto& sub = *std::get<1>(call.subroutine).subroutine;
        if (sub.kind == SubroutineKind::Function && sysTaskCode) {
            context.addDiag(*sysTaskCode, range);
            return false;
        }

        if (sub.hasOutputArgs) {
            context.addDiag(outArgCode, range);
            return false;
        }
    }
    else {
        auto& sub = *std::get<0>(call.subroutine);
        auto args = call.arguments();
        size_t index = 0;
        for (auto& formal : sub.getArguments()) {
            if (formal->direction == ArgumentDirection::Out ||
                formal->direction == ArgumentDirection::InOut) {
                auto& diag = context.addDiag(outArgCode, range);
                diag.addNote(diag::NoteDeclarationHere, formal->location);
                return false;
            }

            if (formal->direction == ArgumentDirection::Ref) {
                ASSERT(index < args.size());
                if (auto sym = args[index]->getSymbolReference()) {
                    if (VariableSymbol::isKind(sym->kind) &&
                        sym->as<VariableSymbol>().lifetime == VariableLifetime::Automatic) {
                        auto& diag = context.addDiag(refArgCode, args[index]->sourceRange);
                        diag << sym->name << formal->name;
                        diag.addNote(diag::NoteDeclarationHere, sym->location);
                        return false;
                    }
                }
            }

            index++;
        }
    }

    return true;
}